

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLCellLinOp::restriction
          (MLCellLinOp *this,int amrlev,int cmglev,MultiFab *crse,MultiFab *fine)

{
  pointer pIVar1;
  int ncomp;
  IntVect ratio;
  IntVect local_38;
  
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  if (amrlev < 1) {
    pIVar1 = (this->super_MLLinOp).mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38.vect[2] = pIVar1[(long)cmglev + -1].vect[2];
    local_38.vect._0_8_ = *(undefined8 *)pIVar1[(long)cmglev + -1].vect;
  }
  else {
    local_38.vect[0] = 2;
    local_38.vect[1] = 2;
    local_38.vect[2] = 2;
  }
  average_down(fine,crse,0,ncomp,&local_38);
  return;
}

Assistant:

void
MLCellLinOp::restriction (int amrlev, int cmglev, MultiFab& crse, MultiFab& fine) const
{
    const int ncomp = getNComp();
#ifdef AMREX_SOFT_PERF_COUNTERS
    perf_counters.restrict(crse);
#endif
    IntVect ratio = (amrlev > 0) ? IntVect(2) : mg_coarsen_ratio_vec[cmglev-1];
    amrex::average_down(fine, crse, 0, ncomp, ratio);
}